

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O0

void scheck_tempv(int n,float *tempv)

{
  char local_128 [8];
  char msg [256];
  uint local_1c;
  int i;
  float *tempv_local;
  int n_local;
  
  for (local_1c = 0; (int)local_1c < n; local_1c = local_1c + 1) {
    if ((tempv[(int)local_1c] != 0.0) || (NAN(tempv[(int)local_1c]))) {
      fprintf(_stderr,"tempv[%d] = %f\n",(double)tempv[(int)local_1c],(ulong)local_1c);
      sprintf(local_128,"%s at line %d in file %s\n","scheck_tempv",0x15b,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sutil.c");
      superlu_abort_and_exit(local_128);
    }
  }
  return;
}

Assistant:

void scheck_tempv(int n, float *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if (tempv[i] != 0.0) 
	{
	    fprintf(stderr,"tempv[%d] = %f\n", i,tempv[i]);
	    ABORT("scheck_tempv");
	}
    }
}